

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum.c
# Opt level: O0

void bn_almost_mont_sqr_u32(uint32_t len,uint32_t *n,uint32_t nInv_u64,uint32_t *aM,uint32_t *resM)

{
  long lVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  uint32_t uVar5;
  uint32_t len_00;
  uint uVar6;
  uint32_t *puVar7;
  uint32_t auStack_60 [2];
  uint32_t *local_58;
  uint32_t *local_50;
  ulong local_48;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  uint32_t *local_30;
  uint32_t *resM_local;
  uint32_t *aM_local;
  uint32_t *puStack_18;
  uint32_t nInv_u64_local;
  uint32_t *n_local;
  uint32_t len_local;
  
  __vla_expr0 = (unsigned_long)&local_58;
  local_30 = resM;
  resM_local = aM;
  aM_local._4_4_ = nInv_u64;
  puStack_18 = n;
  n_local._4_4_ = len;
  if (0x3fffffffffffffff < (ulong)(len * 2)) {
    auStack_60[0] = 0x1e237b;
    auStack_60[1] = 0;
    printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
           "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_Bignum.c"
           ,0x50a);
    auStack_60[0] = 0x1e2385;
    auStack_60[1] = 0;
    exit(0xfd);
  }
  __vla_expr1 = (unsigned_long)(len * 2);
  lVar1 = -(__vla_expr1 * 4 + 0xf & 0xfffffffffffffff0);
  puVar7 = (uint32_t *)((long)&local_58 + lVar1);
  local_50 = puVar7;
  *(undefined8 *)((long)auStack_60 + lVar1) = 0x1e23c5;
  memset(puVar7,0,(ulong)(len * 2) << 2);
  if (0x3fffffffffffffff < (ulong)(n_local._4_4_ << 2)) {
    *(undefined8 *)((long)auStack_60 + lVar1) = 0x1e23f6;
    printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
           "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_Bignum.c"
           ,0x50d);
    *(undefined8 *)((long)auStack_60 + lVar1) = 0x1e2400;
    exit(0xfd);
  }
  local_48 = (ulong)(n_local._4_4_ << 2);
  puVar7 = puVar7 + -local_48;
  uVar6 = n_local._4_4_ << 2;
  local_58 = puVar7;
  puVar7[-2] = 0x1e2437;
  puVar7[-1] = 0;
  memset(puVar7,0,(ulong)uVar6 << 2);
  uVar5 = n_local._4_4_;
  puVar4 = resM_local;
  puVar3 = local_50;
  puVar2 = local_58;
  puVar7[-2] = 0x1e244b;
  puVar7[-1] = 0;
  Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint32(uVar5,puVar4,puVar2,puVar3);
  len_00 = n_local._4_4_;
  puVar4 = puStack_18;
  uVar5 = aM_local._4_4_;
  puVar3 = local_30;
  puVar2 = local_50;
  puVar7[-2] = 0x1e2462;
  puVar7[-1] = 0;
  Hacl_Bignum_AlmostMontgomery_bn_almost_mont_reduction_u32(len_00,puVar4,uVar5,puVar2,puVar3);
  return;
}

Assistant:

static void
bn_almost_mont_sqr_u32(
  uint32_t len,
  uint32_t *n,
  uint32_t nInv_u64,
  uint32_t *aM,
  uint32_t *resM
)
{
  KRML_CHECK_SIZE(sizeof (uint32_t), len + len);
  uint32_t c[len + len];
  memset(c, 0U, (len + len) * sizeof (uint32_t));
  KRML_CHECK_SIZE(sizeof (uint32_t), 4U * len);
  uint32_t tmp[4U * len];
  memset(tmp, 0U, 4U * len * sizeof (uint32_t));
  Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint32(len, aM, tmp, c);
  Hacl_Bignum_AlmostMontgomery_bn_almost_mont_reduction_u32(len, n, nInv_u64, c, resM);
}